

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-bounds.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *this;
  SaveBlock save;
  SaveBlock save_00;
  LoadBlock load_;
  LoadBlock load__00;
  bool bVar1;
  undefined8 *puVar2;
  int i;
  long lVar3;
  int iVar4;
  undefined7 uStack_31d8;
  bool help;
  int tot_blocks;
  undefined4 uStack_31cc;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_31c8;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_31c0;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_31b8;
  QueuePolicy *pQStack_31b0;
  environment env;
  code *local_31a8 [2];
  code *local_3198;
  code *local_3190;
  communicator world;
  int nvals;
  ContiguousAssigner read_assigner;
  ContiguousAssigner assigner;
  code *local_3148 [2];
  code *local_3138;
  code *local_3130;
  code *local_3128 [2];
  code *local_3118;
  code *local_3110;
  code *local_3108 [2];
  code *local_30f8;
  code *local_30f0;
  code *local_30e8 [2];
  code *local_30d8;
  code *local_30d0;
  code *local_30c8 [2];
  code *local_30b8;
  code *local_30b0;
  code *local_30a8 [2];
  code *local_3098;
  code *local_3090;
  code *local_3088 [2];
  code *local_3078;
  code *local_3070;
  communicator local_3068;
  communicator local_3050;
  _Any_data local_3038;
  undefined8 local_3028;
  undefined8 uStack_3020;
  _Any_data local_3018;
  undefined8 local_3008;
  undefined8 uStack_3000;
  _Vector_base<int,_std::allocator<int>_> local_2ff8;
  _Vector_base<double,_std::allocator<double>_> local_2fd8;
  Options ops;
  _Any_data local_2f88;
  undefined8 local_2f78;
  undefined8 uStack_2f70;
  code *local_2f68 [2];
  code *local_2f58;
  code *local_2f50;
  _Bvector_base<std::allocator<bool>_> local_2f48;
  _Bvector_base<std::allocator<bool>_> local_2f18;
  Bounds dom_bounds;
  FileStorage storage;
  Decomposer decomposer;
  Master read_master;
  Master master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  tot_blocks = world.size_;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  nvals = 100;
  this = &ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&master,"tot_blocks",(allocator<char> *)local_3148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&read_master," total number of blocks",(allocator<char> *)&assigner);
  opts::Option<int>((opts *)&local_31b8,'b',(string *)&master,&tot_blocks,(string *)&read_master);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_31b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&decomposer,"nvals",(allocator<char> *)&read_assigner);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dom_bounds," number of values per block",
             (allocator<char> *)((long)&uStack_31cc + 3));
  opts::Option<int>((opts *)&local_31c0,'n',(string *)&decomposer,&nvals,(string *)&dom_bounds);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_31c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&storage,"help",(allocator<char> *)((long)&uStack_31cc + 2));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_31a8," show help",(allocator<char> *)((long)&uStack_31cc + 1));
  opts::Option<bool>((opts *)&local_31c8,'h',(string *)&storage,&help,(string *)local_31a8);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_31c8);
  if (local_31c8._M_head_impl != (BasicOption *)0x0) {
    (*(local_31c8._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_31c8._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)local_31a8);
  std::__cxx11::string::~string((string *)&storage);
  if (local_31c0._M_head_impl != (BasicOption *)0x0) {
    (*(local_31c0._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_31c0._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&dom_bounds);
  std::__cxx11::string::~string((string *)&decomposer);
  if (local_31b8._M_head_impl != (BasicOption *)0x0) {
    (*(local_31b8._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_31b8._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&read_master);
  std::__cxx11::string::~string((string *)&master);
  bVar1 = opts::Options::parse(&ops,argc,argv);
  if ((bVar1) && (help != true)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&master,"./DIY.XXXXXX",(allocator<char> *)&read_master);
    diy::FileStorage::FileStorage(&storage,(string *)&master);
    std::__cxx11::string::~string((string *)&master);
    local_3050.comm_.data = world.comm_.data;
    local_3050.owner_ = false;
    local_3088[1] = (code *)0x0;
    local_3088[0] = Block::create;
    local_3070 = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_3078 = std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_30a8[1] = (code *)0x0;
    local_30a8[0] = Block::destroy;
    local_3090 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_30c8[1] = (code *)0x0;
    local_3098 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_30c8[0] = Block::save;
    local_30b0 = std::
                 _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
                 ::_M_invoke;
    local_30e8[1] = (code *)0x0;
    local_30b8 = std::
                 _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
                 ::_M_manager;
    local_30e8[0] = Block::load;
    local_30d0 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_invoke;
    local_30d8 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_manager;
    puVar2 = (undefined8 *)operator_new(0x10);
    *puVar2 = &PTR_unload_incoming_0014b2b8;
    puVar2[1] = 0x1000;
    save.super__Function_base._M_functor._8_8_ = local_30e8;
    save.super__Function_base._M_functor._M_unused._M_object = local_30c8;
    save.super__Function_base._M_manager = (_Manager_type)puVar2;
    save._M_invoker._0_7_ = uStack_31d8;
    save._M_invoker._7_1_ = help;
    load_.super__Function_base._M_functor._4_4_ = uStack_31cc;
    load_.super__Function_base._M_functor._0_4_ = tot_blocks;
    load_.super__Function_base._M_functor._8_8_ = local_31c8._M_head_impl;
    load_.super__Function_base._M_manager = (_Manager_type)local_31c0._M_head_impl;
    load_._M_invoker = (_Invoker_type)local_31b8._M_head_impl;
    diy::Master::Master(&master,&local_3050,1,-1,(CreateBlock *)local_3088,
                        (DestroyBlock *)local_30a8,&storage.super_ExternalStorage,save,load_,
                        pQStack_31b0);
    std::_Function_base::~_Function_base((_Function_base *)local_30e8);
    std::_Function_base::~_Function_base((_Function_base *)local_30c8);
    std::_Function_base::~_Function_base((_Function_base *)local_30a8);
    std::_Function_base::~_Function_base((_Function_base *)local_3088);
    diy::mpi::communicator::~communicator(&local_3050);
    assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    assigner.super_StaticAssigner.super_Assigner.nblocks_ = tot_blocks;
    assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_0014b310;
    diy::Bounds<double>::Bounds(&dom_bounds,3);
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      dom_bounds.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_begin[lVar3] =
           -1.0;
      dom_bounds.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_begin[lVar3] =
           1.0;
    }
    local_2f18._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_2f18._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_2f18._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
    local_2f18._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_2f18._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_2f18._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
    local_2f18._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_2f48._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_2f48._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_2f48._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_2f48._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
    local_2f48._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_2f48._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_2f48._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
    local_2fd8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2fd8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2fd8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2ff8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2ff8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2ff8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    diy::RegularDecomposer<diy::Bounds<double>_>::RegularDecomposer
              (&decomposer,3,&dom_bounds,tot_blocks,(BoolVector *)&local_2f18,
               (BoolVector *)&local_2f48,(CoordinateVector *)&local_2fd8,
               (DivisionsVector *)&local_2ff8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2ff8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2fd8);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_2f48);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_2f18);
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    read_master.blocks_.create_.super__Function_base._M_functor._M_unused._M_object =
         std::
         _Function_handler<void_(int,_diy::Bounds<double>,_diy::Bounds<double>,_diy::Bounds<double>,_diy::RegularLink<diy::Bounds<double>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:152:26)>
         ::_M_invoke;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(int,_diy::Bounds<double>,_diy::Bounds<double>,_diy::Bounds<double>,_diy::RegularLink<diy::Bounds<double>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:152:26)>
                  ::_M_manager;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&master;
    diy::RegularDecomposer<diy::Bounds<double>_>::decompose
              (&decomposer,world.rank_,&assigner.super_StaticAssigner,(Creator *)&read_master);
    std::_Function_base::~_Function_base((_Function_base *)&read_master);
    local_31a8[0] = (code *)0x0;
    local_31a8[1] = (code *)0x0;
    local_3190 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_invoke;
    local_3198 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_manager;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    read_master.blocks_.create_.super__Function_base._M_functor._M_unused._M_object =
         std::
         _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:156:20)>
         ::_M_invoke;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:156:20)>
                  ::_M_manager;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&nvals;
    diy::Master::foreach_<Block>(&master,(Callback<Block> *)&read_master,(Skip *)local_31a8);
    std::_Function_base::~_Function_base((_Function_base *)&read_master);
    std::_Function_base::~_Function_base((_Function_base *)local_31a8);
    local_31a8[0] = Block::print_data;
    local_31a8[1] = (code *)0x0;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    read_master.blocks_.create_.super__Function_base._M_functor._M_unused._M_object =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                  _M_manager;
    diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
              (&master,(offset_in_Block_to_subr *)local_31a8,(Skip *)&read_master);
    std::_Function_base::~_Function_base((_Function_base *)&read_master);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_31a8,"test.out",(allocator<char> *)local_3148);
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__MemoryBuffer_0014b410;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    read_master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    read_master.blocks_.create_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    read_master.blocks_.create_.super__Function_base._M_functor._8_8_ = 0;
    read_master.blocks_.create_.super__Function_base._M_manager = (_Manager_type)0x0;
    read_master.blocks_.create_._M_invoker = (_Invoker_type)0x0;
    read_master.blocks_.destroy_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    read_master.blocks_.destroy_.super__Function_base._M_functor._8_8_ = 0;
    local_2f88._M_unused._M_object = (void *)0x0;
    local_2f88._8_8_ = 0;
    local_2f78 = 0;
    uStack_2f70 = 0;
    diy::io::write_blocks
              ((string *)local_31a8,&world,&master,(MemoryBuffer *)&read_master,
               (SaveBlock *)&local_2f88);
    std::_Function_base::~_Function_base((_Function_base *)&local_2f88);
    diy::MemoryBuffer::~MemoryBuffer((MemoryBuffer *)&read_master);
    std::__cxx11::string::~string((string *)local_31a8);
    local_3068.comm_.data = world.comm_.data;
    local_3068.owner_ = false;
    local_3108[1] = (code *)0x0;
    local_3108[0] = Block::create;
    local_30f0 = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_3128[1] = (code *)0x0;
    local_30f8 = std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_3128[0] = Block::destroy;
    local_3110 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_3118 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_3018._M_unused._M_object = (void *)0x0;
    local_3018._8_8_ = 0;
    local_3008 = 0;
    uStack_3000 = 0;
    local_3038._M_unused._M_object = (void *)0x0;
    local_3038._8_8_ = 0;
    local_3028 = 0;
    uStack_3020 = 0;
    puVar2 = (undefined8 *)operator_new(0x10);
    *puVar2 = &PTR_unload_incoming_0014b2b8;
    puVar2[1] = 0x1000;
    save_00.super__Function_base._M_functor._8_8_ = &local_3038;
    save_00.super__Function_base._M_functor._M_unused._M_object = &local_3018;
    save_00.super__Function_base._M_manager = (_Manager_type)puVar2;
    save_00._M_invoker._0_7_ = uStack_31d8;
    save_00._M_invoker._7_1_ = help;
    load__00.super__Function_base._M_functor._4_4_ = uStack_31cc;
    load__00.super__Function_base._M_functor._0_4_ = tot_blocks;
    load__00.super__Function_base._M_functor._8_8_ = local_31c8._M_head_impl;
    load__00.super__Function_base._M_manager = (_Manager_type)local_31c0._M_head_impl;
    load__00._M_invoker = (_Invoker_type)local_31b8._M_head_impl;
    diy::Master::Master(&read_master,&local_3068,1,-1,(CreateBlock *)local_3108,
                        (DestroyBlock *)local_3128,(ExternalStorage *)0x0,save_00,load__00,
                        pQStack_31b0);
    std::_Function_base::~_Function_base((_Function_base *)&local_3038);
    std::_Function_base::~_Function_base((_Function_base *)&local_3018);
    std::_Function_base::~_Function_base((_Function_base *)local_3128);
    std::_Function_base::~_Function_base((_Function_base *)local_3108);
    diy::mpi::communicator::~communicator(&local_3068);
    read_assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    read_assigner.super_StaticAssigner.super_Assigner.nblocks_ = -1;
    read_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_0014b310;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_31a8,"test.out",(allocator<char> *)local_3148);
    local_2f68[1] = (code *)0x0;
    local_2f68[0] = Block::load;
    local_2f50 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_invoke;
    local_2f58 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_manager;
    diy::io::read_blocks
              ((string *)local_31a8,&world,&read_assigner.super_StaticAssigner,&read_master,
               (LoadBlock *)local_2f68);
    std::_Function_base::~_Function_base((_Function_base *)local_2f68);
    std::__cxx11::string::~string((string *)local_31a8);
    local_31a8[0] =
         (code *)CONCAT44(local_31a8[0]._4_4_,
                          (int)((ulong)((long)read_master.blocks_.elements_.
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)read_master.blocks_.elements_.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3));
    fmt::v7::print<char[26],unsigned_int,char>
              (_stderr,(char (*) [26])"{} blocks read from file\n",(uint *)local_31a8);
    local_3148[0] = Block::print_data;
    local_3148[1] = (code *)0x0;
    local_31a8[0] = (code *)0x0;
    local_31a8[1] = (code *)0x0;
    local_3190 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_invoke;
    local_3198 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_manager;
    diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
              (&read_master,(offset_in_Block_to_subr *)local_3148,(Skip *)local_31a8);
    std::_Function_base::~_Function_base((_Function_base *)local_31a8);
    local_3148[0] = (code *)0x0;
    local_3148[1] = (code *)0x0;
    local_3130 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_invoke;
    local_3138 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_manager;
    local_3190 = std::
                 _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:180:20)>
                 ::_M_invoke;
    local_3198 = std::
                 _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/custom-bounds.cpp:180:20)>
                 ::_M_manager;
    local_31a8[0] = (code *)&master;
    local_31a8[1] = (code *)&read_master;
    diy::Master::foreach_<Block>(&master,(Callback<Block> *)local_31a8,(Skip *)local_3148);
    std::_Function_base::~_Function_base((_Function_base *)local_31a8);
    std::_Function_base::~_Function_base((_Function_base *)local_3148);
    diy::Master::~Master(&read_master);
    diy::RegularDecomposer<diy::Bounds<double>_>::~RegularDecomposer(&decomposer);
    diy::Bounds<double>::~Bounds(&dom_bounds);
    diy::Master::~Master(&master);
    diy::FileStorage::~FileStorage(&storage);
    iVar4 = 0;
  }
  else {
    iVar4 = 1;
    if (world.rank_ == 0) {
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  opts::Options::~Options(&ops);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    // initialize MPI
    diy::mpi::environment  env(argc, argv);     // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator world;               // equivalent of MPI_COMM_WORLD

    int tot_blocks  = world.size();             // default number of global blocks
    int mem_blocks  = -1;                       // everything in core for now
    int num_threads = 1;                        // 1 thread for now
    int dom_dim     = 3;                        // domain dimensionality
    int nvals       = 100;                      // number of values per block

    // get command line arguments
    bool help;
    opts::Options ops;
    ops >> opts::Option('b', "tot_blocks",  tot_blocks, " total number of blocks")
        >> opts::Option('n', "nvals",       nvals,      " number of values per block")
        >> opts::Option('h', "help",        help,       " show help");

  if (!ops.parse(argc,argv) || help)
  {
        if (world.rank() == 0)
            std::cout << ops;
        return 1;
    }

    // initialize DIY
    diy::FileStorage          storage("./DIY.XXXXXX"); // used for blocks to be moved out of core
    diy::Master               master(world,
                                     num_threads,
                                     mem_blocks,
                                     &Block::create,
                                     &Block::destroy,
                                     &storage,
                                     &Block::save,
                                     &Block::load);
    diy::ContiguousAssigner   assigner(world.size(), tot_blocks);

    // set global domain bounds
    Bounds dom_bounds(dom_dim);
    for (int i = 0; i < dom_dim; ++i)
    {
        dom_bounds.min[i] = -1.0;
        dom_bounds.max[i] =  1.0;
    }

    // decompose the domain into blocks
    Decomposer decomposer(dom_dim, dom_bounds, tot_blocks);
    decomposer.decompose(world.rank(),
                         assigner,
                         [&](int gid, const Bounds& core, const Bounds& bounds, const Bounds& domain, const RCLink& link)
                         { Block::add(gid, core, bounds, domain, link, master); });

    // initialize
    master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
            { b->init_data(cp, nvals); });

    // debug: print the blocks
    master.foreach(&Block::print_data);

    // save the results in diy format
    diy::io::write_blocks("test.out", world, master);

    // read the results back
    diy::Master read_master(world,
            1,
            -1,
            &Block::create,
            &Block::destroy);
    diy::ContiguousAssigner   read_assigner(world.size(), -1);   // number of blocks set by read_blocks()

    diy::io::read_blocks("test.out", world, read_assigner, read_master, &Block::load);
    fmt::print(stderr, "{} blocks read from file\n", read_master.size());

    // debug: print the blocks
    read_master.foreach(&Block::print_data);

    // compare
    master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
            { b->compare_data(cp, master, read_master); });
}